

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O2

bool __thiscall BaseIndex::Commit(BaseIndex *this)

{
  Chain *chain;
  string_view source_file;
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Logger *pLVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  CDBBatch batch;
  _Vector_base<uint256,_std::allocator<uint256>_> local_68;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_best_block_index)._M_b._M_p != (__pointer_type)0x0) {
    iVar3 = (*(this->super_CValidationInterface)._vptr_CValidationInterface[0xf])(this);
    CDBBatch::CDBBatch(&batch,(CDBWrapper *)CONCAT44(extraout_var,iVar3));
    iVar3 = (*(this->super_CValidationInterface)._vptr_CValidationInterface[0xd])(this,&batch);
    if ((char)iVar3 == '\0') {
      CDBBatch::~CDBBatch(&batch);
    }
    else {
      (*(this->super_CValidationInterface)._vptr_CValidationInterface[0xf])(this);
      chain = (this->m_chain)._M_t.
              super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t
              .super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
              super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
      CBlockIndex::GetBlockHash((uint256 *)&local_48,(this->m_best_block_index)._M_b._M_p);
      GetLocator((CBlockLocator *)&local_68,chain,(uint256 *)&local_48);
      CDBBatch::Write<unsigned_char,CBlockLocator>(&batch,"B9BaseIndex",(CBlockLocator *)&local_68);
      std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base(&local_68);
      iVar3 = (*(this->super_CValidationInterface)._vptr_CValidationInterface[0xf])(this);
      bVar1 = CDBWrapper::WriteBatch((CDBWrapper *)CONCAT44(extraout_var_00,iVar3),&batch,false);
      CDBBatch::~CDBBatch(&batch);
      bVar2 = true;
      if (bVar1) goto LAB_003d789c;
    }
  }
  pLVar4 = LogInstance();
  bVar1 = BCLog::Logger::Enabled(pLVar4);
  if (bVar1) {
    batch.parent = (CDBWrapper *)&batch.ssKey;
    batch.m_impl_batch._M_t.
    super___uniq_ptr_impl<CDBBatch::WriteBatchImpl,_std::default_delete<CDBBatch::WriteBatchImpl>_>.
    _M_t.
    super__Tuple_impl<0UL,_CDBBatch::WriteBatchImpl_*,_std::default_delete<CDBBatch::WriteBatchImpl>_>
    .super__Head_base<0UL,_CDBBatch::WriteBatchImpl_*,_false>._M_head_impl =
         (__uniq_ptr_data<CDBBatch::WriteBatchImpl,_std::default_delete<CDBBatch::WriteBatchImpl>,_true,_true>
          )(__uniq_ptr_impl<CDBBatch::WriteBatchImpl,_std::default_delete<CDBBatch::WriteBatchImpl>_>
            )0x0;
    batch.ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = 0;
    tinyformat::format<char[7],std::__cxx11::string>
              (&local_48,(tinyformat *)"%s: Failed to commit latest %s state\n","Commit",
               (char (*) [7])&this->m_name,in_R8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&batch,&local_48
              );
    std::__cxx11::string::~string((string *)&local_48);
    pLVar4 = LogInstance();
    local_48._M_dataplus._M_p = (pointer)0x57;
    local_48._M_string_length = 0x6e2bb7;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/base.cpp";
    source_file._M_len = 0x57;
    str._M_str = (char *)batch.parent;
    str._M_len = (size_t)batch.m_impl_batch._M_t.
                         super___uniq_ptr_impl<CDBBatch::WriteBatchImpl,_std::default_delete<CDBBatch::WriteBatchImpl>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_CDBBatch::WriteBatchImpl_*,_std::default_delete<CDBBatch::WriteBatchImpl>_>
                         .super__Head_base<0UL,_CDBBatch::WriteBatchImpl_*,_false>._M_head_impl;
    logging_function._M_str = "Commit";
    logging_function._M_len = 6;
    BCLog::Logger::LogPrintStr(pLVar4,str,logging_function,source_file,0xf0,ALL,Error);
    std::__cxx11::string::~string((string *)&batch);
  }
  bVar2 = false;
LAB_003d789c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool BaseIndex::Commit()
{
    // Don't commit anything if we haven't indexed any block yet
    // (this could happen if init is interrupted).
    bool ok = m_best_block_index != nullptr;
    if (ok) {
        CDBBatch batch(GetDB());
        ok = CustomCommit(batch);
        if (ok) {
            GetDB().WriteBestBlock(batch, GetLocator(*m_chain, m_best_block_index.load()->GetBlockHash()));
            ok = GetDB().WriteBatch(batch);
        }
    }
    if (!ok) {
        LogError("%s: Failed to commit latest %s state\n", __func__, GetName());
        return false;
    }
    return true;
}